

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcSurfaceStyleRendering::IfcSurfaceStyleRendering
          (IfcSurfaceStyleRendering *this)

{
  IfcSurfaceStyleRendering *this_local;
  
  STEP::Object::Object((Object *)&this->field_0xe8,"IfcSurfaceStyleRendering");
  IfcSurfaceStyleShading::IfcSurfaceStyleShading
            (&this->super_IfcSurfaceStyleShading,&PTR_construction_vtable_24__01114a38);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleRendering,_8UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleRendering,_8UL> *)
             &(this->super_IfcSurfaceStyleShading).
              super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>.field_0x18,
             &PTR_construction_vtable_24__01114a58);
  (this->super_IfcSurfaceStyleShading).
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>._vptr_ObjectHelper =
       (_func_int **)0x11149d0;
  *(undefined8 *)&this->field_0xe8 = 0x1114a20;
  *(undefined8 *)
   &(this->super_IfcSurfaceStyleShading).
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSurfaceStyleShading,_1UL>.field_0x18 = 0x11149f8;
  STEP::Maybe<double>::Maybe((Maybe<double> *)&(this->super_IfcSurfaceStyleShading).field_0x28);
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Maybe(&this->DiffuseColour);
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Maybe
            (&this->TransmissionColour);
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Maybe
            (&this->DiffuseTransmissionColour);
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Maybe
            (&this->ReflectionColour);
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Maybe(&this->SpecularColour)
  ;
  STEP::Maybe<std::shared_ptr<const_Assimp::STEP::EXPRESS::DataType>_>::Maybe
            (&this->SpecularHighlight);
  std::__cxx11::string::string((string *)&this->ReflectanceMethod);
  return;
}

Assistant:

IfcSurfaceStyleRendering() : Object("IfcSurfaceStyleRendering") {}